

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_windows.cpp
# Opt level: O3

void __thiscall Screen_Manager::Wait_For_Event(Screen_Manager *this,timeval *timeout)

{
  int iVar1;
  Screen_Info *pSVar2;
  
  do {
    pSVar2 = this->head;
    do {
      iVar1 = XPending(pSVar2->dpy);
      if (iVar1 != 0) {
        return;
      }
      pSVar2 = pSVar2->next;
    } while (pSVar2 != this->head);
    Block(this,timeout);
  } while( true );
}

Assistant:

void
Screen_Manager::Wait_For_Event(timeval *timeout)
{
  while (!Pending())
    Block(timeout);
}